

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_2.h
# Opt level: O3

void __thiscall
dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::dequeue
          (queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,directory *item)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  node *item_00;
  
  std::swap<dlib::directory::data>(&item->state,&this->out->item[this->out_pos].state);
  uVar2 = this->out_pos + 1;
  this->out_pos = uVar2;
  uVar1 = this->queue_size - 1;
  this->queue_size = uVar1;
  if (uVar2 == 0x14) {
    this->out_pos = 0;
    item_00 = this->out;
    this->out = item_00->next;
  }
  else {
    if (uVar1 != 0) goto LAB_00236ae6;
    item_00 = this->out;
  }
  memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
  ::deallocate(&this->pool,item_00);
LAB_00236ae6:
  (*(this->super_enumerable<dlib::directory>)._vptr_enumerable[3])(this);
  return;
}

Assistant:

void queue_kernel_2<T,block_size,mem_manager>::
    dequeue (
        T& item
    )
    {
        // swap out into item
        exchange(item,out->item[out_pos]);
        
        ++out_pos;
        --queue_size;

        // if this was the last element in this node then remove this node
        if (out_pos == block_size)
        {
            out_pos = 0;
            node* temp = out;
            out = out->next;
            pool.deallocate(temp);
        }
        else if (queue_size == 0)
        {
            pool.deallocate(out);
        }

        // put the enumerator at the start
        reset();
    }